

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> *field)

{
  Memory *pMVar1;
  size_t *psVar2;
  pointer *pppMVar3;
  MemoryModuleField *pMVar4;
  iterator __position;
  ModuleField *pMVar5;
  ModuleFieldList *pMVar6;
  Memory *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pMVar4 = (field->_M_t).
           super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
           .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl;
  pMVar1 = &pMVar4->memory;
  if (*(size_type *)((long)&(pMVar4->memory).name + 8) != 0) {
    local_48 = (Memory *)
               (((Location *)
                ((long)&(pMVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField
                + 0x18))->filename).data_;
    uStack_40 = *(undefined4 *)
                 ((long)&(pMVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
                         super_ModuleField + 0x20);
    uStack_3c = *(undefined4 *)
                 ((long)&(pMVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
                         super_ModuleField + 0x24);
    local_38 = (((anon_union_16_2_ecfd7102_for_Location_1 *)
                ((long)&(pMVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField
                + 0x28))->field_0).line;
    uStack_34 = *(undefined4 *)
                 ((long)&(pMVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
                         super_ModuleField + 0x2c);
    uStack_30 = *(undefined4 *)
                 ((long)&(pMVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
                         super_ModuleField + 0x30);
    uStack_2c = *(undefined4 *)
                 ((long)&(pMVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
                         super_ModuleField + 0x34);
    local_28 = (undefined4)
               ((ulong)((long)(this->memories).
                              super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->memories).
                             super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->memory_bindings,0,pMVar1);
  }
  __position._M_current =
       (this->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48 = pMVar1;
  if (__position._M_current ==
      (this->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::Memory*,std::allocator<wabt::Memory*>>::_M_realloc_insert<wabt::Memory*>
              ((vector<wabt::Memory*,std::allocator<wabt::Memory*>> *)&this->memories,__position,
               &local_48);
  }
  else {
    *__position._M_current = pMVar1;
    pppMVar3 = &(this->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppMVar3 = *pppMVar3 + 1;
  }
  pMVar4 = (field->_M_t).
           super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
           .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>.
  super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl = (MemoryModuleField *)0x0;
  if ((*(ModuleField **)
        ((long)&(pMVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField + 0x10)
       == (ModuleField *)0x0) &&
     (((intrusive_list_base<wabt::ModuleField> *)
      ((long)&(pMVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField + 8))->
      next_ == (ModuleField *)0x0)) {
    pMVar5 = (this->fields).last_;
    if (pMVar5 == (ModuleField *)0x0) {
      pMVar6 = &this->fields;
    }
    else {
      *(ModuleField **)
       ((long)&(pMVar4->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField + 0x10)
           = pMVar5;
      pMVar6 = (ModuleFieldList *)&pMVar5->super_intrusive_list_base<wabt::ModuleField>;
    }
    pMVar6->first_ = (ModuleField *)pMVar4;
    (this->fields).last_ = (ModuleField *)pMVar4;
    psVar2 = &(this->fields).size_;
    *psVar2 = *psVar2 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                ,0x1bf,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<MemoryModuleField> field) {
  Memory& memory = field->memory;
  if (!memory.name.empty()) {
    memory_bindings.emplace(memory.name, Binding(field->loc, memories.size()));
  }
  memories.push_back(&memory);
  fields.push_back(std::move(field));
}